

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

string * __thiscall
pfederc::TraitExpr::toString_abi_cxx11_(string *__return_storage_ptr__,TraitExpr *this)

{
  _Head_base<0UL,_pfederc::Capabilities_*,_false> caps;
  pointer puVar1;
  bool bVar2;
  char cVar3;
  _List_node_base *p_Var4;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *impltrait;
  pointer puVar5;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  caps._M_head_impl =
       (this->super_Capable).caps._M_t.
       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>.
       _M_t.
       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
       super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
  if (caps._M_head_impl != (Capabilities *)0x0) {
    _capsToString_abi_cxx11_(&local_50,caps._M_head_impl);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->templs).
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->templs).
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _templateToString_abi_cxx11_(&local_50,&this->templs);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  cVar3 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar3);
  (*this->tokId->_vptr_Token[2])(&local_50,this->tokId,(this->super_Expr).lexer);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  if ((this->impltraits).
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->impltraits).
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar1 = (this->impltraits).
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    for (puVar5 = (this->impltraits).
                  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1)
    {
      if (!bVar2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      (*((puVar5->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
         _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_50);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = false;
    }
  }
  std::__cxx11::string::push_back(cVar3);
  p_Var4 = (_List_node_base *)&this->functions;
  while (p_Var4 = (((_List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->functions) {
    FuncExpr::toString_abi_cxx11_(&local_50,(FuncExpr *)p_Var4[1]._M_next);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::push_back(cVar3);
  }
  std::__cxx11::string::push_back(cVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string TraitExpr::toString() const noexcept {
  std::string result;
  if (caps)
    result += _capsToString(*caps);

  result += "trait";
  if (!templs.empty()) {
    result += _templateToString(templs);
  }

  result += ' ';
  result += getIdentifier().toString(getLexer());

  if (!impltraits.empty()) {
    result += ": ";
    bool first = true;
    for (auto &impltrait : impltraits) {
      if (!first)
        result += ", ";
      else
        first = false;

      result += impltrait->toString();
    }
  }

  result += '\n';
  for (auto &func : functions) {
    result += func->toString();
    result += '\n';
  }

  result += ';';

  return result;
}